

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

void Abc_SclDeptFanin(SC_Man *p,SC_Timing *pTime,Abc_Obj_t *pObj,Abc_Obj_t *pFanin)

{
  float fVar1;
  SC_Pair *pSVar2;
  SC_Pair *pSVar3;
  SC_Pair *pSVar4;
  SC_TSense SVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  pSVar2 = p->pLoads;
  pSVar3 = p->pDepts;
  uVar7 = (ulong)pFanin & 0xffffffff;
  pSVar4 = p->pSlews;
  uVar6 = (ulong)pObj & 0xffffffff;
  SVar5 = pTime->tsense;
  if ((SVar5 | sc_ts_Neg) == sc_ts_Non) {
    fVar9 = pSVar3[uVar7].rise;
    fVar1 = pSVar3[uVar6].rise;
    fVar8 = Scl_LibLookup(&pTime->pCellRise,pSVar4[uVar7].rise,pSVar2[uVar6].rise);
    fVar8 = fVar8 + fVar1;
    if (fVar9 <= fVar8) {
      fVar9 = fVar8;
    }
    pSVar3[uVar7].rise = fVar9;
    fVar9 = pSVar3[uVar7].fall;
    fVar1 = pSVar3[uVar6].fall;
    fVar8 = Scl_LibLookup(&pTime->pCellFall,pSVar4[uVar7].fall,pSVar2[uVar6].fall);
    fVar8 = fVar8 + fVar1;
    if (fVar9 <= fVar8) {
      fVar9 = fVar8;
    }
    pSVar3[uVar7].fall = fVar9;
    SVar5 = pTime->tsense;
  }
  if ((SVar5 & ~sc_ts_Pos) == sc_ts_Neg) {
    fVar9 = pSVar3[uVar7].fall;
    fVar1 = pSVar3[uVar6].rise;
    fVar8 = Scl_LibLookup(&pTime->pCellRise,pSVar4[uVar7].fall,pSVar2[uVar6].rise);
    fVar8 = fVar8 + fVar1;
    if (fVar9 <= fVar8) {
      fVar9 = fVar8;
    }
    pSVar3[uVar7].fall = fVar9;
    fVar9 = pSVar3[uVar7].rise;
    fVar1 = pSVar3[uVar6].fall;
    fVar8 = Scl_LibLookup(&pTime->pCellFall,pSVar4[uVar7].rise,pSVar2[uVar6].fall);
    fVar8 = fVar8 + fVar1;
    if (fVar9 <= fVar8) {
      fVar9 = fVar8;
    }
    pSVar3[uVar7].rise = fVar9;
  }
  return;
}

Assistant:

static inline void Abc_SclDeptFanin( SC_Man * p, SC_Timing * pTime, Abc_Obj_t * pObj, Abc_Obj_t * pFanin )
{
    SC_Pair * pDepIn   = Abc_SclObjDept( p, pFanin );   // modified
    SC_Pair * pSlewIn  = Abc_SclObjSlew( p, pFanin );
    SC_Pair * pLoad    = Abc_SclObjLoad( p, pObj );
    SC_Pair * pDepOut  = Abc_SclObjDept( p, pObj );
    Scl_LibPinDeparture( pTime, pDepIn, pSlewIn, pLoad, pDepOut );
}